

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json11.cpp
# Opt level: O1

Json __thiscall
json11::anon_unknown_22::JsonParser::expect(JsonParser *this,string *expected,Json *res)

{
  undefined8 *puVar1;
  size_t sVar2;
  int iVar3;
  long *plVar4;
  undefined8 *puVar5;
  undefined8 *in_RCX;
  ulong *puVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  ulong uVar8;
  Json JVar9;
  ulong *local_a0;
  long local_98;
  ulong local_90;
  long lStack_88;
  undefined8 *local_80;
  undefined8 local_78;
  undefined8 local_70;
  undefined8 uStack_68;
  ulong *local_60;
  long local_58;
  ulong local_50 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var7;
  
  if (expected->_M_string_length == 0) {
    __assert_fail("i != 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/bernhardfritz[P]mariobreaksout/lib/piksel/lib/json11/json11/json11.cpp"
                  ,0x276,
                  "Json json11::(anonymous namespace)::JsonParser::expect(const string &, Json)");
  }
  uVar8 = expected->_M_string_length - 1;
  expected->_M_string_length = uVar8;
  iVar3 = std::__cxx11::string::compare
                    ((ulong)(expected->_M_dataplus)._M_p,uVar8,
                     (string *)
                     (res->m_ptr).super___shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
  if (iVar3 == 0) {
    expected->_M_string_length =
         (long)&((res->m_ptr).super___shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_vptr__Sp_counted_base + expected->_M_string_length;
    this->str = (string *)*in_RCX;
    this->i = 0;
    sVar2 = in_RCX[1];
    in_RCX[1] = 0;
    this->i = sVar2;
    *in_RCX = 0;
    _Var7._M_pi = extraout_RDX;
    goto LAB_0017060b;
  }
  std::operator+(&local_40,"parse error: expected ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)res);
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_40);
  puVar6 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar6) {
    local_90 = *puVar6;
    lStack_88 = plVar4[3];
    local_a0 = &local_90;
  }
  else {
    local_90 = *puVar6;
    local_a0 = (ulong *)*plVar4;
  }
  local_98 = plVar4[1];
  *plVar4 = (long)puVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  std::__cxx11::string::substr((ulong)&local_60,(ulong)(expected->_M_dataplus)._M_p);
  uVar8 = 0xf;
  if (local_a0 != &local_90) {
    uVar8 = local_90;
  }
  if (uVar8 < (ulong)(local_58 + local_98)) {
    uVar8 = 0xf;
    if (local_60 != local_50) {
      uVar8 = local_50[0];
    }
    if (uVar8 < (ulong)(local_58 + local_98)) goto LAB_0017054b;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_60,0,(char *)0x0,(ulong)local_a0);
  }
  else {
LAB_0017054b:
    puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_a0,(ulong)local_60);
  }
  local_80 = &local_70;
  puVar1 = puVar5 + 2;
  if ((undefined8 *)*puVar5 == puVar1) {
    local_70 = *puVar1;
    uStack_68 = puVar5[3];
  }
  else {
    local_70 = *puVar1;
    local_80 = (undefined8 *)*puVar5;
  }
  local_78 = puVar5[1];
  *puVar5 = puVar1;
  puVar5[1] = 0;
  *(undefined1 *)puVar1 = 0;
  JVar9 = fail(this,expected);
  _Var7._M_pi = JVar9.m_ptr.super___shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
  if (local_80 != &local_70) {
    operator_delete(local_80);
    _Var7._M_pi = extraout_RDX_00;
  }
  if (local_60 != local_50) {
    operator_delete(local_60);
    _Var7._M_pi = extraout_RDX_01;
  }
  if (local_a0 != &local_90) {
    operator_delete(local_a0);
    _Var7._M_pi = extraout_RDX_02;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
    _Var7._M_pi = extraout_RDX_03;
  }
LAB_0017060b:
  JVar9.m_ptr.super___shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var7._M_pi;
  JVar9.m_ptr.super___shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (Json)JVar9.m_ptr.super___shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Json expect(const string &expected, Json res) {
        assert(i != 0);
        i--;
        if (str.compare(i, expected.length(), expected) == 0) {
            i += expected.length();
            return res;
        } else {
            return fail("parse error: expected " + expected + ", got " + str.substr(i, expected.length()));
        }
    }